

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Gia_Man_t * Lf_ManDeriveMappingCoarse(Lf_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  Jf_Par_t *pJVar6;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  uint *puVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Vec_Int_t *pVVar12;
  int *__ptr;
  Gia_Obj_t *pGVar13;
  Lf_Cut_t *pLVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  Vec_Int_t **local_38;
  
  if ((p->pPars->fCutMin != 0) || (pGVar4 = p->pGia, pGVar4->pMuxes == (uint *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && pGia->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x6cc,"Gia_Man_t *Lf_ManDeriveMappingCoarse(Lf_Man_t *)");
  }
  p_00 = Gia_ManStart(pGVar4->nObjs);
  pcVar5 = pGVar4->pName;
  if (pcVar5 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar5);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar5);
  }
  p_00->pName = pcVar11;
  pcVar5 = pGVar4->pSpec;
  if (pcVar5 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar5);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar5);
  }
  p_00->pSpec = pcVar11;
  uVar21 = (ulong)(uint)pGVar4->nObjs;
  uVar15 = pGVar4->nObjs + (pGVar4->nXors + pGVar4->nMuxes) * 2;
  pJVar6 = p->pPars;
  iVar2 = (int)pJVar6->Mux7;
  iVar3 = (int)pJVar6->Edge + uVar15 + (int)pJVar6->Area * 2;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  iVar17 = 0x10;
  if (0xe < (uint)(iVar3 + -1 + iVar2 * 4)) {
    iVar17 = iVar3 + iVar2 * 4;
  }
  pVVar12->nSize = 0;
  pVVar12->nCap = iVar17;
  if (iVar17 == 0) {
    pVVar12->pArray = (int *)0x0;
    p_00->vMapping = pVVar12;
    if ((int)uVar15 < 1) goto LAB_0076c1cf;
    sVar10 = (ulong)uVar15 << 2;
LAB_0076c1a0:
    __ptr = (int *)malloc(sVar10);
LAB_0076c1a8:
    pVVar12->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar12->nCap = uVar15;
  }
  else {
    __ptr = (int *)malloc((long)iVar17 << 2);
    pVVar12->pArray = __ptr;
    p_00->vMapping = pVVar12;
    if (iVar17 < (int)uVar15) {
      sVar10 = (long)(int)uVar15 << 2;
      if (__ptr == (int *)0x0) goto LAB_0076c1a0;
      __ptr = (int *)realloc(__ptr,sVar10);
      goto LAB_0076c1a8;
    }
  }
  if (0 < (int)uVar15) {
    memset(__ptr,0,(ulong)uVar15 << 2);
    uVar21 = (ulong)(uint)pGVar4->nObjs;
  }
LAB_0076c1cf:
  local_38 = &p_00->vMapping;
  pVVar12->nSize = uVar15;
  pGVar4->pObjs->Value = 0;
  if (1 < (int)uVar21) {
    lVar22 = 1;
    do {
      pGVar1 = pGVar4->pObjs + lVar22;
      uVar7 = *(ulong *)pGVar1;
      uVar15 = (uint)uVar7;
      if ((uVar15 & 0x9fffffff) == 0x9fffffff) {
        pGVar13 = Gia_ManAppendObj(p_00);
        uVar21 = *(ulong *)pGVar13;
        *(ulong *)pGVar13 = uVar21 | 0x9fffffff;
        *(ulong *)pGVar13 =
             uVar21 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar8 = p_00->pObjs;
        if ((pGVar13 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar13)) {
LAB_0076c62f:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar8) >> 2) * -0x55555555);
        pGVar8 = p_00->pObjs;
        if ((pGVar13 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar13)) goto LAB_0076c62f;
        uVar15 = (int)((ulong)((long)pGVar13 - (long)pGVar8) >> 2) * 0x55555556;
LAB_0076c351:
        pGVar1->Value = uVar15;
      }
      else {
        uVar20 = uVar7 & 0x1fffffff;
        if (uVar20 != 0x1fffffff && (int)uVar15 < 0) {
          if ((int)pGVar1[-uVar20].Value < 0) goto LAB_0076c66d;
          uVar15 = Gia_ManAppendCo(p_00,pGVar1[-uVar20].Value ^ uVar15 >> 0x1d & 1);
          goto LAB_0076c351;
        }
        uVar18 = uVar15 & 0x1fffffff;
        uVar16 = (uint)(uVar7 >> 0x20);
        if (((-1 < (int)uVar15) && (uVar18 != 0x1fffffff)) && (uVar18 == (uVar16 & 0x1fffffff))) {
          if ((int)pGVar1[-uVar20].Value < 0) goto LAB_0076c66d;
          uVar15 = Gia_ManAppendBuf(p_00,pGVar1[-uVar20].Value ^ uVar15 >> 0x1d & 1);
          goto LAB_0076c351;
        }
        puVar9 = pGVar4->pMuxes;
        if ((puVar9 == (uint *)0x0) || (puVar9[lVar22] == 0)) {
          uVar19 = pGVar1[-uVar20].Value;
          if ((uVar20 != 0x1fffffff && -1 < (int)uVar15) && uVar18 < (uVar16 & 0x1fffffff)) {
            if (((int)uVar19 < 0) || ((int)pGVar1[-(ulong)(uVar16 & 0x1fffffff)].Value < 0))
            goto LAB_0076c66d;
            uVar19 = uVar19 ^ (uint)(uVar7 >> 0x1d) & 1;
            uVar15 = pGVar1[-(ulong)(uVar16 & 0x1fffffff)].Value ^ uVar16 >> 0x1d & 1;
            uVar16 = uVar15 ^ 1;
            goto LAB_0076c4b2;
          }
          if (((int)uVar19 < 0) || ((int)pGVar1[-(ulong)(uVar16 & 0x1fffffff)].Value < 0)) {
LAB_0076c66d:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar15 = Gia_ManAppendAnd(p_00,uVar19 ^ (uint)(uVar7 >> 0x1d) & 1,
                                    pGVar1[-(ulong)(uVar16 & 0x1fffffff)].Value ^ uVar16 >> 0x1d & 1
                                   );
        }
        else {
          uVar18 = puVar9[lVar22];
          if ((int)uVar18 < 0) goto LAB_0076c64e;
          if ((int)uVar21 <= (int)(uVar18 >> 1)) {
LAB_0076c610:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar19 = pGVar4->pObjs[uVar18 >> 1].Value;
          if ((((int)uVar19 < 0) || ((int)pGVar1[-(ulong)(uVar16 & 0x1fffffff)].Value < 0)) ||
             ((int)pGVar1[-uVar20].Value < 0)) goto LAB_0076c66d;
          uVar19 = uVar19 ^ uVar18 & 1;
          uVar16 = pGVar1[-(ulong)(uVar16 & 0x1fffffff)].Value ^ uVar16 >> 0x1d & 1;
          uVar15 = pGVar1[-uVar20].Value ^ uVar15 >> 0x1d & 1;
LAB_0076c4b2:
          uVar15 = Gia_ManAppendMux(p_00,uVar19,uVar16,uVar15);
        }
        pGVar1->Value = uVar15;
        if ((p->vOffsets).nSize <= lVar22) {
LAB_0076c68c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = (p->vOffsets).pArray[lVar22];
        if (((long)iVar3 < 0) || ((p->vMapRefs).nSize <= iVar3)) goto LAB_0076c68c;
        if ((p->vMapRefs).pArray[iVar3] != 0) {
          pLVar14 = Lf_ObjCutBest(p,(int)lVar22);
          if ((int)pGVar1->Value < 0) {
LAB_0076c64e:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          pVVar12 = *local_38;
          uVar15 = pGVar1->Value >> 1;
          if (pVVar12->nSize <= (int)uVar15) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar12->pArray[uVar15] = pVVar12->nSize;
          Vec_IntPush(pVVar12,(uint)(byte)pLVar14->field_0x17);
          uVar15 = *(uint *)&pLVar14->field_0x14;
          if (0xffffff < uVar15) {
            uVar21 = 0;
            do {
              iVar3 = *(int *)((long)&pLVar14[1].Sign + uVar21 * 4);
              if (((long)iVar3 < 0) || (pGVar4->nObjs <= iVar3)) goto LAB_0076c610;
              uVar15 = pGVar4->pObjs[iVar3].Value;
              if ((int)uVar15 < 0) goto LAB_0076c64e;
              Vec_IntPush(*local_38,uVar15 >> 1);
              uVar21 = uVar21 + 1;
              uVar15 = *(uint *)&pLVar14->field_0x14;
            } while (uVar21 < uVar15 >> 0x18);
          }
          uVar16 = pGVar1->Value;
          if ((uVar15 >> 0x17 & 1) == 0) {
            if ((int)uVar16 < 0) goto LAB_0076c64e;
            uVar16 = uVar16 >> 1;
          }
          else {
            if ((int)uVar16 < 0) goto LAB_0076c64e;
            uVar16 = -(uVar16 >> 1);
          }
          Vec_IntPush(*local_38,uVar16);
        }
      }
      lVar22 = lVar22 + 1;
      uVar21 = (ulong)pGVar4->nObjs;
    } while (lVar22 < (long)uVar21);
  }
  Gia_ManSetRegNum(p_00,pGVar4->nRegs);
  iVar3 = p_00->vMapping->nCap;
  if ((iVar3 != 0x10) && (p_00->vMapping->nSize != iVar3)) {
    __assert_fail("Vec_IntCap(pNew->vMapping) == 16 || Vec_IntSize(pNew->vMapping) == Vec_IntCap(pNew->vMapping)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x6ee,"Gia_Man_t *Lf_ManDeriveMappingCoarse(Lf_Man_t *)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Lf_ManDeriveMappingCoarse( Lf_Man_t * p )
{
    Gia_Man_t * pNew, * pGia = p->pGia;
    Gia_Obj_t * pObj;
    Lf_Cut_t * pCut;
    int i, k;
    assert( !p->pPars->fCutMin && pGia->pMuxes );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(pGia) );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    // start mapping
    pNew->vMapping = Vec_IntAlloc( Gia_ManObjNum(pGia) + 2*Gia_ManXorNum(pGia) + 2*Gia_ManMuxNum(pGia) + (int)p->pPars->Edge + 2*(int)p->pPars->Area + 4*(int)p->pPars->Mux7 );
    Vec_IntFill( pNew->vMapping, Gia_ManObjNum(pGia) + 2*Gia_ManXorNum(pGia) + 2*Gia_ManMuxNum(pGia), 0 );
    // process objects
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachObj1( pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            { pObj->Value = Gia_ManAppendCi( pNew ); continue; }
        if ( Gia_ObjIsCo(pObj) )
            { pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ); continue; }
        if ( Gia_ObjIsBuf(pObj) )
            { pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) ); continue; }
        if ( Gia_ObjIsMuxId(pGia, i) )
            pObj->Value = Gia_ManAppendMux( pNew, Gia_ObjFanin2Copy(pGia, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        pCut = Lf_ObjCutBest( p, i );
        Vec_IntWriteEntry( pNew->vMapping, Abc_Lit2Var(pObj->Value), Vec_IntSize(pNew->vMapping) );
        Vec_IntPush( pNew->vMapping, pCut->nLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_IntPush( pNew->vMapping, Abc_Lit2Var(Gia_ManObj(pGia, pCut->pLeaves[k])->Value) );
        Vec_IntPush( pNew->vMapping, pCut->fMux7 ? -Abc_Lit2Var(pObj->Value) : Abc_Lit2Var(pObj->Value) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    assert( Vec_IntCap(pNew->vMapping) == 16 || Vec_IntSize(pNew->vMapping) == Vec_IntCap(pNew->vMapping) );
    return pNew;
}